

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::Tokenizer::
ConsumeOneOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(Tokenizer *this,char *error)

{
  char *__s;
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *error_local;
  Tokenizer *this_local;
  
  local_18 = error;
  error_local = (char *)this;
  bVar1 = anon_unknown_0::Digit::InClass(this->current_char_);
  __s = local_18;
  if (bVar1) {
    do {
      NextChar(this);
      bVar1 = anon_unknown_0::Digit::InClass(this->current_char_);
    } while (bVar1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    AddError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

inline void Tokenizer::ConsumeOneOrMore(const char* error) {
  if (!CharacterClass::InClass(current_char_)) {
    AddError(error);
  } else {
    do {
      NextChar();
    } while (CharacterClass::InClass(current_char_));
  }
}